

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void insert(upb_table *t,lookupkey_t key,upb_tabkey tabkey,upb_value val,uint32_t hash,
           hashfunc_t *hashfunc,eqlfunc_t *eql)

{
  _upb_tabent *p_Var1;
  uint64_t uVar2;
  upb_tabent *puVar3;
  _Bool _Var4;
  uint32_t uVar5;
  ulong uVar6;
  upb_tabent *puVar7;
  uint uVar8;
  upb_tabent *puVar9;
  long lVar10;
  upb_tabent *puVar11;
  upb_tabent *puVar12;
  
  if (t->size_lg2 != '\0') {
    uVar8 = t->mask & hash;
    if (t->entries[uVar8].key != 0) {
      puVar7 = t->entries + uVar8;
      do {
        _Var4 = (*eql)(puVar7->key,key);
        if (_Var4) {
          __assert_fail("findentry(t, key, hash, eql) == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                        ,0xa2,
                        "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                       );
        }
        puVar7 = puVar7->next;
      } while (puVar7 != (_upb_tabent *)0x0);
    }
  }
  t->count = t->count + 1;
  puVar7 = t->entries;
  uVar6 = (ulong)(t->mask & hash);
  puVar12 = puVar7 + uVar6;
  if (puVar12->key != 0) {
    lVar10 = 0;
    if (t->size_lg2 != 0) {
      lVar10 = (long)(1 << (t->size_lg2 & 0x1f));
    }
    puVar9 = puVar7 + lVar10;
    puVar3 = puVar7 + uVar6 + 1;
    while (puVar11 = puVar3, puVar11 < puVar9) {
      puVar3 = puVar11 + 1;
      if (puVar11->key == 0) goto LAB_001229f5;
    }
    if (lVar10 < 1) goto LAB_00122a75;
    while (puVar11 = puVar7, puVar7->key != 0) {
      puVar7 = puVar7 + 1;
      if (puVar9 <= puVar7) {
LAB_00122a75:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                      ,0x74,"upb_tabent *emptyent(upb_table *, upb_tabent *)");
      }
    }
LAB_001229f5:
    uVar5 = (*hashfunc)(puVar12->key);
    uVar8 = t->mask;
    puVar7 = t->entries;
    if (puVar7 + (uVar5 & uVar8) == puVar12) {
      puVar11->next = puVar12->next;
      puVar12->next = puVar11;
      goto LAB_00122aa3;
    }
    puVar11->next = puVar12->next;
    uVar2 = (puVar12->val).val;
    puVar11->key = puVar12->key;
    (puVar11->val).val = uVar2;
    puVar7 = puVar7 + (uVar5 & uVar8);
    while (p_Var1 = puVar7->next, p_Var1 != puVar12) {
      puVar7 = p_Var1;
      if (p_Var1 == (_upb_tabent *)0x0) {
        __assert_fail("chain",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                      ,0xbe,
                      "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                     );
      }
    }
    puVar7->next = puVar11;
  }
  puVar12->next = (_upb_tabent *)0x0;
  puVar11 = puVar12;
LAB_00122aa3:
  puVar11->key = tabkey;
  (puVar11->val).val = val.val;
  if (t->size_lg2 != '\0') {
    uVar8 = hash & t->mask;
    if (t->entries[uVar8].key != 0) {
      puVar7 = t->entries + uVar8;
      do {
        _Var4 = (*eql)(puVar7->key,key);
        if (_Var4) goto LAB_00122af7;
        puVar7 = puVar7->next;
      } while (puVar7 != (_upb_tabent *)0x0);
    }
  }
  puVar7 = (upb_tabent *)0x0;
LAB_00122af7:
  if (puVar7 != puVar11) {
    __assert_fail("findentry(t, key, hash, eql) == our_e",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                  ,199,
                  "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  return;
}

Assistant:

static void insert(upb_table* t, lookupkey_t key, upb_tabkey tabkey,
                   upb_value val, uint32_t hash, hashfunc_t* hashfunc,
                   eqlfunc_t* eql) {
  upb_tabent* mainpos_e;
  upb_tabent* our_e;

  UPB_ASSERT(findentry(t, key, hash, eql) == NULL);

  t->count++;
  mainpos_e = getentry_mutable(t, hash);
  our_e = mainpos_e;

  if (upb_tabent_isempty(mainpos_e)) {
    /* Our main position is empty; use it. */
    our_e->next = NULL;
  } else {
    /* Collision. */
    upb_tabent* new_e = emptyent(t, mainpos_e);
    /* Head of collider's chain. */
    upb_tabent* chain = getentry_mutable(t, hashfunc(mainpos_e->key));
    if (chain == mainpos_e) {
      /* Existing ent is in its main position (it has the same hash as us, and
       * is the head of our chain).  Insert to new ent and append to this chain.
       */
      new_e->next = mainpos_e->next;
      mainpos_e->next = new_e;
      our_e = new_e;
    } else {
      /* Existing ent is not in its main position (it is a node in some other
       * chain).  This implies that no existing ent in the table has our hash.
       * Evict it (updating its chain) and use its ent for head of our chain. */
      *new_e = *mainpos_e; /* copies next. */
      while (chain->next != mainpos_e) {
        chain = (upb_tabent*)chain->next;
        UPB_ASSERT(chain);
      }
      chain->next = new_e;
      our_e = mainpos_e;
      our_e->next = NULL;
    }
  }
  our_e->key = tabkey;
  our_e->val.val = val.val;
  UPB_ASSERT(findentry(t, key, hash, eql) == our_e);
}